

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  Module *out_module;
  ScriptModuleType SVar1;
  WastParseOptions *pWVar2;
  Command *pCVar3;
  _func_int **pp_Var4;
  undefined4 uVar5;
  ScriptModuleType SVar6;
  undefined4 uVar7;
  Command *pCVar8;
  pointer pEVar9;
  Result RVar10;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> _Var11;
  Index IVar12;
  pointer pEVar13;
  long lVar14;
  Errors errors;
  Command *local_b0;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> local_a0;
  Command *local_98;
  CommandPtr *local_90;
  ReadBinaryOptions local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  Errors local_48;
  
  pCVar8 = local_b0;
  local_a0._M_head_impl = (ScriptModule *)0x0;
  RVar10 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                   *)&local_a0);
  if (RVar10.enum_ == Error) {
    RVar10.enum_ = Error;
    _Var11._M_head_impl = local_a0._M_head_impl;
  }
  else {
    MakeUnique<wabt::ModuleCommand>();
    _Var11._M_head_impl = local_a0._M_head_impl;
    SVar1 = (local_a0._M_head_impl)->type_;
    if (SVar1 == Quoted) {
      local_88.features._0_8_ = &local_88.log_stream;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"a binary module","");
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"a text module","");
      local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 (string *)&local_88,&local_48);
      lVar14 = 0;
      RVar10 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_48,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      do {
        if (local_58 + lVar14 != *(undefined1 **)((long)local_68 + lVar14)) {
          operator_delete(*(undefined1 **)((long)local_68 + lVar14));
        }
        lVar14 = lVar14 + -0x20;
      } while (lVar14 != -0x40);
    }
    else {
      out_module = (Module *)(local_b0 + 1);
      if (SVar1 == Binary) {
        local_88.log_stream = (Stream *)0x0;
        local_88._24_3_ = 0x10100;
        pWVar2 = this->options_;
        local_88.features.bulk_memory_enabled_ = (pWVar2->features).bulk_memory_enabled_;
        local_88.features.reference_types_enabled_ = (pWVar2->features).reference_types_enabled_;
        local_88.features.annotations_enabled_ = (pWVar2->features).annotations_enabled_;
        local_88.features.gc_enabled_ = (pWVar2->features).gc_enabled_;
        local_88.features._0_8_ = *(undefined8 *)&pWVar2->features;
        local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_90 = out_command;
        ReadBinaryIr("<text>",local_a0._M_head_impl[5]._vptr_ScriptModule,
                     *(long *)&local_a0._M_head_impl[5].type_ -
                     (long)local_a0._M_head_impl[5]._vptr_ScriptModule,&local_88,&local_48,
                     out_module);
        local_98 = local_b0;
        std::__cxx11::string::_M_assign((string *)(local_b0 + 3));
        pEVar9 = local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pp_Var4 = _Var11._M_head_impl[1]._vptr_ScriptModule;
        SVar6 = _Var11._M_head_impl[1].type_;
        uVar7 = *(undefined4 *)&_Var11._M_head_impl[1].field_0xc;
        SVar1 = _Var11._M_head_impl[2].type_;
        uVar5 = *(undefined4 *)&_Var11._M_head_impl[2].field_0xc;
        local_b0[2]._vptr_Command = _Var11._M_head_impl[2]._vptr_ScriptModule;
        local_b0[2].type = SVar1;
        *(undefined4 *)&local_b0[2].field_0xc = uVar5;
        (out_module->loc).filename.data_ = (char *)pp_Var4;
        local_b0[1].type = SVar6;
        *(undefined4 *)&local_b0[1].field_0xc = uVar7;
        for (pEVar13 = local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                       _M_impl.super__Vector_impl_data._M_start; pEVar13 != pEVar9;
            pEVar13 = pEVar13 + 1) {
          if (pEVar13->error_level != Error) {
            __assert_fail("error.error_level == ErrorLevel::Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                          ,0xb03,
                          "Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)");
          }
          if ((pEVar13->loc).field_1.field_1.offset == 0xffffffffffffffff) {
            Error(this,0x1cea76,(pEVar13->message)._M_dataplus._M_p);
          }
          else {
            Error(this,0x1cea91);
          }
        }
        std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_48);
        out_command = local_90;
      }
      else {
        local_98 = local_b0;
        if (SVar1 == Text) {
          Module::operator=(out_module,(Module *)(local_a0._M_head_impl + 1));
        }
      }
      if (script != (Script *)0x0) {
        IVar12 = (Index)((ulong)((long)(script->commands).
                                       super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(script->commands).
                                      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if (*(long *)&local_98[3].type != 0) {
          local_88.features._0_8_ = (out_module->loc).filename.data_;
          local_88.features._8_4_ = local_b0[1].type;
          local_88._12_4_ = *(undefined4 *)&local_b0[1].field_0xc;
          local_88.log_stream = (Stream *)local_b0[2]._vptr_Command;
          local_88._24_4_ = local_b0[2].type;
          local_88._28_4_ = *(undefined4 *)&local_b0[2].field_0xc;
          local_68[0] = (undefined1 *)CONCAT44(local_68[0]._4_4_,IVar12);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)&script->module_bindings,0,local_98 + 3);
        }
        this->last_module_index_ = IVar12;
      }
      local_b0 = (Command *)0x0;
      pCVar3 = (out_command->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar8;
      if (pCVar3 == (Command *)0x0) {
        RVar10.enum_ = Ok;
        goto LAB_00180d54;
      }
      (*pCVar3->_vptr_Command[1])();
      RVar10.enum_ = Ok;
    }
    if (local_b0 != (Command *)0x0) {
      (*local_b0->_vptr_Command[1])();
    }
  }
LAB_00180d54:
  if (_Var11._M_head_impl != (ScriptModule *)0x0) {
    (*(_Var11._M_head_impl)->_vptr_ScriptModule[1])(_Var11._M_head_impl);
  }
  return (Result)RVar10.enum_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  auto command = MakeUnique<ModuleCommand>();
  Module& module = command->module;

  switch (script_module->type()) {
    case ScriptModuleType::Text:
      module = std::move(cast<TextScriptModule>(script_module.get())->module);
      break;

    case ScriptModuleType::Binary: {
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, &module);
      module.name = bsm->name;
      module.loc = bsm->loc;
      for (const auto& error: errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module.name.empty()) {
      script->module_bindings.emplace(module.name,
                                      Binding(module.loc, command_index));
    }

    last_module_index_ = command_index;
  }

  *out_command = std::move(command);
  return Result::Ok;
}